

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jdmarker.c
# Opt level: O1

boolean next_marker(j_decompress_ptr cinfo)

{
  uint *puVar1;
  byte bVar2;
  uint uVar3;
  jpeg_source_mgr *pjVar4;
  jpeg_error_mgr *pjVar5;
  boolean bVar6;
  byte *pbVar7;
  size_t sVar8;
  
  pjVar4 = cinfo->src;
  pbVar7 = pjVar4->next_input_byte;
  sVar8 = pjVar4->bytes_in_buffer;
  while( true ) {
    if (sVar8 == 0) {
      bVar6 = (*pjVar4->fill_input_buffer)(cinfo);
      if (bVar6 == 0) {
        return 0;
      }
      pbVar7 = pjVar4->next_input_byte;
      sVar8 = pjVar4->bytes_in_buffer;
    }
    bVar2 = *pbVar7;
    while( true ) {
      sVar8 = sVar8 - 1;
      pbVar7 = pbVar7 + 1;
      if (bVar2 == 0xff) break;
      puVar1 = &cinfo->marker->discarded_bytes;
      *puVar1 = *puVar1 + 1;
      pjVar4->next_input_byte = pbVar7;
      pjVar4->bytes_in_buffer = sVar8;
      if (sVar8 == 0) {
        bVar6 = (*pjVar4->fill_input_buffer)(cinfo);
        if (bVar6 == 0) {
          return 0;
        }
        pbVar7 = pjVar4->next_input_byte;
        sVar8 = pjVar4->bytes_in_buffer;
      }
      bVar2 = *pbVar7;
    }
    do {
      if (sVar8 == 0) {
        bVar6 = (*pjVar4->fill_input_buffer)(cinfo);
        if (bVar6 == 0) {
          return 0;
        }
        pbVar7 = pjVar4->next_input_byte;
        sVar8 = pjVar4->bytes_in_buffer;
      }
      sVar8 = sVar8 - 1;
      bVar2 = *pbVar7;
      pbVar7 = pbVar7 + 1;
    } while (bVar2 == 0xff);
    if (bVar2 != 0) break;
    puVar1 = &cinfo->marker->discarded_bytes;
    *puVar1 = *puVar1 + 2;
    pjVar4->next_input_byte = pbVar7;
    pjVar4->bytes_in_buffer = sVar8;
  }
  uVar3 = cinfo->marker->discarded_bytes;
  if (uVar3 != 0) {
    pjVar5 = cinfo->err;
    pjVar5->msg_code = 0x77;
    (pjVar5->msg_parm).i[0] = uVar3;
    (cinfo->err->msg_parm).i[1] = (uint)bVar2;
    (*cinfo->err->emit_message)((j_common_ptr)cinfo,-1);
    cinfo->marker->discarded_bytes = 0;
  }
  cinfo->unread_marker = (uint)bVar2;
  pjVar4->next_input_byte = pbVar7;
  pjVar4->bytes_in_buffer = sVar8;
  return 1;
}

Assistant:

LOCAL(boolean)
next_marker (j_decompress_ptr cinfo)
{
  int c;
  INPUT_VARS(cinfo);

  for (;;) {
    INPUT_BYTE(cinfo, c, return FALSE);
    /* Skip any non-FF bytes.
     * This may look a bit inefficient, but it will not occur in a valid file.
     * We sync after each discarded byte so that a suspending data source
     * can discard the byte from its buffer.
     */
    while (c != 0xFF) {
      cinfo->marker->discarded_bytes++;
      INPUT_SYNC(cinfo);
      INPUT_BYTE(cinfo, c, return FALSE);
    }
    /* This loop swallows any duplicate FF bytes.  Extra FFs are legal as
     * pad bytes, so don't count them in discarded_bytes.  We assume there
     * will not be so many consecutive FF bytes as to overflow a suspending
     * data source's input buffer.
     */
    do {
      INPUT_BYTE(cinfo, c, return FALSE);
    } while (c == 0xFF);
    if (c != 0)
      break;			/* found a valid marker, exit loop */
    /* Reach here if we found a stuffed-zero data sequence (FF/00).
     * Discard it and loop back to try again.
     */
    cinfo->marker->discarded_bytes += 2;
    INPUT_SYNC(cinfo);
  }

  if (cinfo->marker->discarded_bytes != 0) {
    WARNMS2(cinfo, JWRN_EXTRANEOUS_DATA, cinfo->marker->discarded_bytes, c);
    cinfo->marker->discarded_bytes = 0;
  }

  cinfo->unread_marker = c;

  INPUT_SYNC(cinfo);
  return TRUE;
}